

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O3

void __thiscall QSyntaxHighlighterPrivate::applyFormatChanges(QSyntaxHighlighterPrivate *this)

{
  Data *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QTextLayout *this_00;
  iterator aend;
  iterator iVar7;
  QObject *this_01;
  FormatRange *pFVar8;
  QTextBlock *this_02;
  long lVar9;
  long lVar10;
  int iVar11;
  undefined1 *puVar12;
  FormatRange *pFVar13;
  long lVar14;
  const_iterator abegin;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextLayout::FormatRange> local_78;
  undefined8 local_58;
  undefined1 auStack_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = &this->currentBlock;
  this_00 = QTextBlock::layout(this_02);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::formats((QList<QTextLayout::FormatRange> *)&local_78,this_00);
  iVar4 = QTextLayout::preeditAreaPosition(this_00);
  QTextLayout::preeditAreaText((QString *)&local_58,this_00);
  iVar6 = (int)auStack_50._8_8_;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (iVar6 == 0) {
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) goto LAB_004b7c0a;
    QList<QTextLayout::FormatRange>::clear((QList<QTextLayout::FormatRange> *)&local_78);
    bVar3 = true;
  }
  else {
    lVar9 = local_78.size >> 2;
    pFVar13 = local_78.ptr;
    puVar12 = (undefined1 *)local_78.size;
    if (0 < lVar9) {
      iVar11 = iVar4 + iVar6;
      pFVar13 = local_78.ptr + lVar9 * 4;
      lVar10 = lVar9 + 1;
      pFVar8 = local_78.ptr + 2;
      do {
        if ((pFVar8[-2].start < iVar4) || (iVar11 < pFVar8[-2].start + pFVar8[-2].length)) {
          pFVar8 = pFVar8 + -2;
          goto LAB_004b7bf7;
        }
        if ((pFVar8[-1].start < iVar4) || (iVar11 < pFVar8[-1].start + pFVar8[-1].length)) {
          pFVar8 = pFVar8 + -1;
          goto LAB_004b7bf7;
        }
        if ((pFVar8->start < iVar4) || (iVar11 < pFVar8->start + pFVar8->length)) goto LAB_004b7bf7;
        if ((pFVar8[1].start < iVar4) || (iVar11 < pFVar8[1].start + pFVar8[1].length)) {
          pFVar8 = pFVar8 + 1;
          goto LAB_004b7bf7;
        }
        lVar10 = lVar10 + -1;
        pFVar8 = pFVar8 + 4;
      } while (1 < lVar10);
      puVar12 = (undefined1 *)((local_78.size * 0x18 + lVar9 * -0x60 >> 3) * -0x5555555555555555);
    }
    if (puVar12 == (undefined1 *)0x1) {
LAB_004b7bd6:
      pFVar8 = local_78.ptr + local_78.size;
      if (iVar6 + iVar4 < pFVar13->length + pFVar13->start) {
        pFVar8 = pFVar13;
      }
      if (pFVar13->start < iVar4) {
        pFVar8 = pFVar13;
      }
    }
    else if (puVar12 == (undefined1 *)0x3) {
      pFVar8 = pFVar13;
      if ((iVar4 <= pFVar13->start) && (pFVar13->start + pFVar13->length <= iVar6 + iVar4)) {
        pFVar13 = pFVar13 + 1;
        goto LAB_004b7bb3;
      }
    }
    else {
      pFVar8 = local_78.ptr + local_78.size;
      if (puVar12 == (undefined1 *)0x2) {
LAB_004b7bb3:
        pFVar8 = pFVar13;
        if ((iVar4 <= pFVar13->start) && (pFVar13->start + pFVar13->length <= iVar6 + iVar4)) {
          pFVar13 = pFVar13 + 1;
          goto LAB_004b7bd6;
        }
      }
    }
LAB_004b7bf7:
    lVar9 = (long)pFVar8 - (long)local_78.ptr;
    if ((lVar9 >> 3) * -0x5555555555555555 - local_78.size == 0) {
LAB_004b7c0a:
      bVar3 = false;
    }
    else {
      aend = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_78);
      iVar7 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&local_78);
      abegin.i = iVar7.i + lVar9;
      pFVar13 = iVar7.i + lVar9 + 0x18;
      if (pFVar13 != aend.i) {
        do {
          if ((iVar4 <= pFVar13->start) && (pFVar13->start + pFVar13->length <= iVar4 + iVar6)) {
            iVar11 = pFVar13->length;
            (abegin.i)->start = pFVar13->start;
            (abegin.i)->length = iVar11;
            QTextFormat::operator=
                      (&((abegin.i)->format).super_QTextFormat,&(pFVar13->format).super_QTextFormat)
            ;
            abegin.i = abegin.i + 1;
          }
          pFVar13 = pFVar13 + 1;
        } while (pFVar13 != aend.i);
      }
      QList<QTextLayout::FormatRange>::erase
                ((QList<QTextLayout::FormatRange> *)&local_78,abegin,(const_iterator)aend.i);
      bVar3 = 0 < (long)aend.i - (long)abegin.i;
    }
  }
  if ((this->formatChanges).d.size == 0) {
joined_r0x004b7de0:
    if (!bVar3) goto LAB_004b7e3e;
  }
  else {
    iVar11 = 0;
    do {
      auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_50);
      lVar10 = (long)iVar11;
      lVar9 = (this->formatChanges).d.size;
      if (lVar10 < lVar9) {
        lVar14 = lVar10 << 4;
        do {
          bVar2 = QTextFormat::operator==
                            ((QTextFormat *)
                             ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr +
                             lVar14),(QTextFormat *)auStack_50);
          lVar9 = (this->formatChanges).d.size;
          if (!bVar2) break;
          lVar10 = lVar10 + 1;
          lVar14 = lVar14 + 0x10;
        } while (lVar10 < lVar9);
        iVar11 = (int)lVar10;
      }
      if (lVar9 == lVar10) {
        QTextFormat::~QTextFormat((QTextFormat *)auStack_50);
        goto joined_r0x004b7de0;
      }
      local_58 = (QArrayData *)CONCAT44(local_58._4_4_,iVar11);
      QTextFormat::operator=
                ((QTextFormat *)auStack_50,&(this->formatChanges).d.ptr[lVar10].super_QTextFormat);
      lVar9 = (long)iVar11;
      if (lVar9 < (this->formatChanges).d.size) {
        lVar10 = lVar9 << 4;
        do {
          bVar3 = QTextFormat::operator==
                            ((QTextFormat *)
                             ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr +
                             lVar10),(QTextFormat *)auStack_50);
          if (!bVar3) break;
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar9 < (this->formatChanges).d.size);
        iVar11 = (int)lVar9;
      }
      iVar5 = iVar11 - (int)local_58;
      local_58 = (QArrayData *)CONCAT44(iVar5,(int)local_58);
      if (iVar6 != 0) {
        if ((int)local_58 < iVar4) {
          if (iVar4 <= iVar11) {
            local_58 = (QArrayData *)CONCAT44(iVar5 + iVar6,(int)local_58);
          }
        }
        else {
          local_58 = (QArrayData *)CONCAT44(iVar5,(int)local_58 + iVar6);
        }
      }
      QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
      emplace<QTextLayout::FormatRange_const&>
                ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_78,local_78.size,
                 (FormatRange *)&local_58);
      QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_78);
      QTextFormat::~QTextFormat((QTextFormat *)auStack_50);
      bVar3 = true;
    } while ((long)iVar11 < (this->formatChanges).d.size);
  }
  QTextLayout::setFormats(this_00,(QList<QTextLayout::FormatRange> *)&local_78);
  pDVar1 = (this->doc).wp.d;
  if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    this_01 = (QObject *)0x0;
  }
  else {
    this_01 = (this->doc).wp.value;
  }
  iVar6 = QTextBlock::position(this_02);
  iVar4 = QTextBlock::length(this_02);
  QTextDocument::markContentsDirty((QTextDocument *)this_01,iVar6,iVar4);
LAB_004b7e3e:
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighterPrivate::applyFormatChanges()
{
    bool formatsChanged = false;

    QTextLayout *layout = currentBlock.layout();

    QList<QTextLayout::FormatRange> ranges = layout->formats();

    const int preeditAreaStart = layout->preeditAreaPosition();
    const int preeditAreaLength = layout->preeditAreaText().size();

    if (preeditAreaLength != 0) {
        auto isOutsidePreeditArea = [=](const QTextLayout::FormatRange &range) {
            return range.start < preeditAreaStart
                    || range.start + range.length > preeditAreaStart + preeditAreaLength;
        };
        if (ranges.removeIf(isOutsidePreeditArea) > 0)
            formatsChanged = true;
    } else if (!ranges.isEmpty()) {
        ranges.clear();
        formatsChanged = true;
    }

    int i = 0;
    while (i < formatChanges.size()) {
        QTextLayout::FormatRange r;

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        if (i == formatChanges.size())
            break;

        r.start = i;
        r.format = formatChanges.at(i);

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        Q_ASSERT(i <= formatChanges.size());
        r.length = i - r.start;

        if (preeditAreaLength != 0) {
            if (r.start >= preeditAreaStart)
                r.start += preeditAreaLength;
            else if (r.start + r.length >= preeditAreaStart)
                r.length += preeditAreaLength;
        }

        ranges << r;
        formatsChanged = true;
    }

    if (formatsChanged) {
        layout->setFormats(ranges);
        doc->markContentsDirty(currentBlock.position(), currentBlock.length());
    }
}